

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

ElementPtr __thiscall
Rml::Element::ReplaceChild(Element *this,ElementPtr *inserted_element,Element *replaced_element)

{
  Element *pEVar1;
  _Head_base<0UL,_Rml::Element_*,_false> this_00;
  code *pcVar2;
  bool bVar3;
  Element *in_RCX;
  const_iterator __position;
  _Head_base<0UL,_Rml::Element_*,_false> _Var4;
  uint uVar5;
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> local_30;
  
  if (((replaced_element->super_ScriptInterface).super_Releasable._vptr_Releasable ==
       (_func_int **)0x0) &&
     (bVar3 = Assert("RMLUI_ASSERT(inserted_element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x582), !bVar3)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  __position._M_current =
       (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
       inserted_element[3]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
       _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  pEVar1 = inserted_element[4]._M_t.
           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  while (((Element *)__position._M_current != pEVar1 &&
         (((__position._M_current)->_M_t).
          super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
          super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
          super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl != in_RCX))) {
    __position._M_current = __position._M_current + 1;
  }
  this_00._M_head_impl =
       (Element *)(replaced_element->super_ScriptInterface).super_Releasable._vptr_Releasable;
  if ((Element *)__position._M_current == pEVar1) {
    (replaced_element->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
    local_30._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
         (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
         (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)this_00._M_head_impl;
    AppendChild((Element *)inserted_element,(ElementPtr *)&local_30,true);
    if ((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
        local_30._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl != (Element *)0x0) {
      (**(code **)(*(long *)local_30._M_t.
                            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl + 0x10))();
    }
    (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
  }
  else {
    ::std::
    vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
    ::_M_insert_rval((vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                      *)(inserted_element + 3),__position,(value_type *)replaced_element);
    SetParent(this_00._M_head_impl,(Element *)inserted_element);
    RemoveChild(this,(Element *)inserted_element);
    _Var4._M_head_impl = this_00._M_head_impl;
    uVar5 = 0;
    do {
      (**(code **)(*(long *)_Var4._M_head_impl + 0x98))(_Var4._M_head_impl,this_00._M_head_impl);
      _Var4._M_head_impl = *(Element **)((long)_Var4._M_head_impl + 0x80);
      if (_Var4._M_head_impl == (Element *)0x0) {
        return (ElementPtr)this;
      }
      bVar3 = uVar5 < 2;
      uVar5 = uVar5 + 1;
    } while (bVar3);
  }
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::ReplaceChild(ElementPtr inserted_element, Element* replaced_element)
{
	RMLUI_ASSERT(inserted_element);
	auto insertion_point = children.begin();
	while (insertion_point != children.end() && insertion_point->get() != replaced_element)
	{
		++insertion_point;
	}

	Element* inserted_element_ptr = inserted_element.get();

	if (insertion_point == children.end())
	{
		AppendChild(std::move(inserted_element));
		return nullptr;
	}

	children.insert(insertion_point, std::move(inserted_element));
	inserted_element_ptr->SetParent(this);

	ElementPtr result = RemoveChild(replaced_element);

	Element* ancestor = inserted_element_ptr;
	for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
		ancestor->OnChildAdd(inserted_element_ptr);

	return result;
}